

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GetRegOpnd(Lowerer *this,Opnd *opnd,Instr *insertInstr,Func *func,IRType type)

{
  bool bVar1;
  RegOpnd *regOpnd;
  IRType type_local;
  Func *func_local;
  Instr *insertInstr_local;
  Opnd *opnd_local;
  Lowerer *this_local;
  
  bVar1 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar1) {
    this_local = (Lowerer *)IR::Opnd::AsRegOpnd(opnd);
  }
  else {
    this_local = (Lowerer *)IR::RegOpnd::New(type,func);
    InsertMove((Opnd *)this_local,opnd,insertInstr,true);
  }
  return (RegOpnd *)this_local;
}

Assistant:

IR::RegOpnd * Lowerer::GetRegOpnd(IR::Opnd* opnd, IR::Instr* insertInstr, Func* func, IRType type)
{
    if (opnd->IsRegOpnd())
    {
        return opnd->AsRegOpnd();
    }
    IR::RegOpnd *regOpnd = IR::RegOpnd::New(type, func);
    InsertMove(regOpnd, opnd, insertInstr);
    return regOpnd;
}